

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit_model.hpp
# Opt level: O2

int add_tree_internal<float,unsigned_long,long_double>
              (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,float *numeric_data,
              size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,float *Xc,
              unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t ndim,size_t ntry,
              CoefType coef_type,bool coef_by_prop,float *sample_weights,size_t nrows,
              size_t max_depth,size_t ncols_per_tree,bool limit_depth,bool penalize_range,
              bool standardize_data,bool fast_bratio,float *col_weights,bool weigh_by_kurt,
              double prob_pick_by_gain_pl,double prob_pick_by_gain_avg,double prob_pick_by_full_gain
              ,double prob_pick_by_dens,double prob_pick_col_by_range,double prob_pick_col_by_var,
              double prob_pick_col_by_kurt,double min_gain,MissingAction missing_action,
              CategSplit cat_split_type,NewCategAction new_cat_action,UseDepthImp depth_imp,
              WeighImpRows weigh_imp_rows,bool all_perm,Imputer *imputer,size_t min_imp_obs,
              TreesIndexer *indexer,float *ref_numeric_data,int *ref_categ_data,
              bool ref_is_col_major,size_t ref_ld_numeric,size_t ref_ld_categ,float *ref_Xc,
              unsigned_long *ref_Xc_ind,unsigned_long *ref_Xc_indptr,uint64_t random_seed)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer puVar4;
  __uniq_ptr_data<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>,_true,_true>
  this;
  ExtIsoForest *pEVar5;
  runtime_error *this_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane_root;
  size_t *n_terminal;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree_root;
  size_t col;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes;
  ulong uVar9;
  TreesIndexer *local_328;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
  workspace;
  SignalSwitcher ss;
  vector<unsigned_long,_std::allocator<unsigned_long>_> terminal_indices;
  ModelParams model_params;
  vector<unsigned_long,_std::allocator<unsigned_long>_> temp;
  InputData<float,_unsigned_long> local_180;
  
  if ((((prob_pick_by_gain_pl < 0.0) || (prob_pick_by_gain_avg < 0.0)) ||
      (prob_pick_by_full_gain < 0.0)) ||
     (((prob_pick_by_dens < 0.0 || (prob_pick_col_by_range < 0.0)) ||
      ((prob_pick_col_by_var < 0.0 || (prob_pick_col_by_kurt < 0.0)))))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot pass negative probabilities.\n");
  }
  else if ((ncols_categ == 0) || ((prob_pick_col_by_range == 0.0 && (!NAN(prob_pick_col_by_range))))
          ) {
    if ((ncols_categ == 0) || ((prob_pick_by_full_gain == 0.0 && (!NAN(prob_pick_by_full_gain))))) {
      if (weigh_by_kurt && prob_pick_col_by_kurt != 0.0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "\'weigh_by_kurt\' and \'prob_pick_col_by_kurt\' cannot be used together.\n");
      }
      else if (model_outputs == (IsoForest *)0x0 && ndim == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Must pass \'ndim>0\' in the extended model.\n");
      }
      else {
        if ((((indexer == (TreesIndexer *)0x0) ||
             (pSVar1 = (indexer->indices).
                       super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl
                       .super__Vector_impl_data._M_start,
             pSVar1 == (indexer->indices).
                       super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl
                       .super__Vector_impl_data._M_finish)) ||
            ((pSVar1->reference_points).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (pSVar1->reference_points).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish)) ||
           ((ref_numeric_data != (float *)0x0 || ref_categ_data != (int *)0x0) ||
            ref_Xc_indptr != (unsigned_long *)0x0)) {
          local_180.max_categ = 0;
          for (sVar6 = 0; ncols_categ != sVar6; sVar6 = sVar6 + 1) {
            if (local_180.max_categ < ncat[sVar6]) {
              local_180.max_categ = ncat[sVar6];
            }
          }
          local_180.ncols_tot = ncols_categ + ncols_numeric;
          uVar8 = ntry;
          if (local_180.ncols_tot < ntry) {
            uVar8 = local_180.ncols_tot;
          }
          if (model_outputs == (IsoForest *)0x0) {
            uVar8 = ntry;
          }
          if (ncols_per_tree == 0) {
            ncols_per_tree = local_180.ncols_tot;
          }
          if (indexer == (TreesIndexer *)0x0) {
            local_328 = (TreesIndexer *)0x0;
          }
          else {
            local_328 = (TreesIndexer *)0x0;
            if ((indexer->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (indexer->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_328 = indexer;
            }
          }
          local_180.ncat = ncat;
          local_180.nrows = nrows;
          local_180.sample_weights = sample_weights;
          local_180.weight_as_sample = false;
          local_180.col_weights = col_weights;
          local_180.Xc = Xc;
          local_180.Xc_ind = Xc_ind;
          local_180.Xc_indptr = Xc_indptr;
          local_180.numeric_data = numeric_data;
          local_180.ncols_numeric = ncols_numeric;
          local_180.categ_data = categ_data;
          local_180.ncols_categ = ncols_categ;
          memset(&local_180.log2_n,0,0xe0);
          model_params.max_depth = nrows - 1;
          if (max_depth != 0) {
            model_params.max_depth = max_depth;
          }
          model_params.with_replacement = false;
          model_params.sample_size = nrows;
          model_params.ntrees = 1;
          model_params.penalize_range = penalize_range;
          model_params.standardize_data = standardize_data;
          model_params.random_seed = random_seed;
          model_params.weigh_by_kurt = weigh_by_kurt;
          model_params.cat_split_type = cat_split_type;
          model_params.new_cat_action = new_cat_action;
          model_params.ndim = 0;
          if (model_outputs == (IsoForest *)0x0) {
            model_params.ndim = ndim;
          }
          model_params.missing_action = missing_action;
          pEVar5 = (ExtIsoForest *)model_outputs;
          if (model_outputs == (IsoForest *)0x0) {
            pEVar5 = model_outputs_ext;
          }
          model_params.scoring_metric = pEVar5->scoring_metric;
          model_params.calc_dist = false;
          model_params.calc_depth = false;
          model_params.fast_bratio = fast_bratio;
          model_params.all_perm = all_perm;
          model_params.coef_type = coef_type;
          model_params.coef_by_prop = coef_by_prop;
          model_params.impute_at_fit = false;
          model_params.depth_imp = depth_imp;
          model_params.weigh_imp_rows = weigh_imp_rows;
          model_params.min_imp_obs = min_imp_obs;
          model_params.ncols_per_tree = ncols_per_tree;
          model_params.prob_pick_by_gain_avg = prob_pick_by_gain_avg;
          model_params.prob_pick_by_gain_pl = prob_pick_by_gain_pl;
          model_params.prob_pick_by_full_gain = prob_pick_by_full_gain;
          model_params.prob_pick_by_dens = prob_pick_by_dens;
          model_params.prob_pick_col_by_range = prob_pick_col_by_range;
          model_params.prob_pick_col_by_var = prob_pick_col_by_var;
          model_params.prob_pick_col_by_kurt = prob_pick_col_by_kurt;
          model_params.min_gain = min_gain;
          model_params.ntry = uVar8;
          if ((prob_pick_by_full_gain != 0.0) || (NAN(prob_pick_by_full_gain))) {
            if (Xc_indptr == (unsigned_long *)0x0) {
              colmajor_to_rowmajor<float>(numeric_data,nrows,ncols_numeric,&local_180.X_row_major);
            }
            else {
              colmajor_to_rowmajor<float,unsigned_long>
                        (Xc,Xc_ind,Xc_indptr,nrows,ncols_numeric,&local_180.Xr,&local_180.Xr_ind,
                         &local_180.Xr_indptr);
            }
          }
          this.
          super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
          .
          super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                )operator_new(0x800);
          memset((void *)this.
                         super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                         .
                         super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
                         ._M_head_impl,0,0x800);
          WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>::WorkerMemory
                    ((WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float> *)
                     this.
                     super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                     .
                     super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
                     ._M_head_impl);
          workspace._M_t.
          super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
          .
          super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>,_true,_true>
                )(__uniq_ptr_data<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>,_true,_true>
                  )this.
                   super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                   .
                   super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
                   ._M_head_impl;
          if (model_outputs == (IsoForest *)0x0) {
            lVar7 = (long)(model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
            ::emplace_back<>(&model_outputs_ext->hplanes);
          }
          else {
            lVar7 = (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::emplace_back<>(&model_outputs->trees);
          }
          if (imputer == (Imputer *)0x0) {
            impute_nodes = (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0;
          }
          else {
            std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::emplace_back<>(&imputer->imputer_tree);
            impute_nodes = (imputer->imputer_tree).
                           super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          if (local_328 != (TreesIndexer *)0x0) {
            std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::emplace_back<>
                      (&local_328->indices);
          }
          SignalSwitcher::SignalSwitcher(&ss);
          check_interrupt_switch(&ss);
          if (model_outputs == (IsoForest *)0x0) {
            tree_root = (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0;
          }
          else {
            tree_root = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          if (model_outputs_ext == (ExtIsoForest *)0x0) {
            hplane_root = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0;
          }
          else {
            hplane_root = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          fit_itree<InputData<float,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,long_double>,long_double,float>,long_double>
                    (tree_root,hplane_root,
                     (WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float> *)
                     workspace._M_t.
                     super___uniq_ptr_impl<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
                     .
                     super__Head_base<0UL,_WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_*,_false>
                     ._M_head_impl,&local_180,&model_params,impute_nodes,lVar7 / 0x18);
          check_interrupt_switch(&ss);
          if (model_outputs == (IsoForest *)0x0) {
            std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::_M_shrink_to_fit
                      ((model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
            pEVar5 = model_outputs_ext;
          }
          else {
            std::vector<IsoTree,_std::allocator<IsoTree>_>::_M_shrink_to_fit
                      ((model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
            pEVar5 = (ExtIsoForest *)model_outputs;
          }
          pEVar5->has_range_penalty = (bool)(pEVar5->has_range_penalty | penalize_range);
          if (imputer != (Imputer *)0x0) {
            std::vector<ImputeNode,_std::allocator<ImputeNode>_>::_M_shrink_to_fit
                      ((imputer->imputer_tree).
                       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
          }
          if (local_328 != (TreesIndexer *)0x0) {
            pSVar2 = (local_328->indices).
                     super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pSVar1 = pSVar2 + -1;
            n_terminal = &pSVar2[-1].n_terminal;
            if (model_outputs == (IsoForest *)0x0) {
              build_terminal_node_mappings_single_tree
                        (&pSVar1->terminal_node_mappings,n_terminal,
                         (model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
            }
            else {
              build_terminal_node_mappings_single_tree
                        (&pSVar1->terminal_node_mappings,n_terminal,
                         (model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
            }
            check_interrupt_switch(&ss);
            pSVar1 = (local_328->indices).
                     super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (*(pointer *)
                 &(pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl !=
                *(pointer *)
                 ((long)&(pSVar1->node_distances).
                         super__Vector_base<double,_std::allocator<double>_> + 8)) {
              temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                        (&temp,(local_328->indices).
                               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].n_terminal);
              pSVar1 = (local_328->indices).
                       super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              if (model_outputs == (IsoForest *)0x0) {
                build_dindex(&temp,&pSVar1[-1].terminal_node_mappings,&pSVar1[-1].node_distances,
                             &pSVar1[-1].node_depths,pSVar1[-1].n_terminal,
                             (model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              }
              else {
                build_dindex(&temp,&pSVar1[-1].terminal_node_mappings,&pSVar1[-1].node_distances,
                             &pSVar1[-1].node_depths,pSVar1[-1].n_terminal,
                             (model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              }
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            }
            check_interrupt_switch(&ss);
            pSVar1 = (local_328->indices).
                     super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3 = *(pointer *)
                      &(pSVar1->reference_points).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            puVar4 = *(pointer *)
                      ((long)&(pSVar1->reference_points).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8)
            ;
            if (puVar3 != puVar4) {
              uVar9 = (long)puVar4 - (long)puVar3;
              uVar8 = (long)uVar9 >> 3;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&terminal_indices,uVar8,(allocator_type *)&temp);
              ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl =
                   (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
                   operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar9);
              if (model_outputs == (IsoForest *)0x0) {
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::push_back((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             *)&temp,(model_outputs_ext->hplanes).
                                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -1);
                predict_iforest<float,unsigned_long>
                          (ref_numeric_data,ref_categ_data,ref_is_col_major,ref_ld_numeric,
                           ref_ld_categ,ref_Xc,ref_Xc_ind,ref_Xc_indptr,(float *)0x0,
                           (unsigned_long *)0x0,(unsigned_long *)0x0,uVar8,1,false,(IsoForest *)0x0,
                           (ExtIsoForest *)&temp,
                           (double *)
                           ignored._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl,
                           terminal_indices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,(double *)0x0,local_328);
                std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::~vector((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           *)&temp);
              }
              else {
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                temp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                std::
                vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ::push_back((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             *)&temp,(model_outputs->trees).
                                     super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -1);
                predict_iforest<float,unsigned_long>
                          (ref_numeric_data,ref_categ_data,ref_is_col_major,ref_ld_numeric,
                           ref_ld_categ,ref_Xc,ref_Xc_ind,ref_Xc_indptr,(float *)0x0,
                           (unsigned_long *)0x0,(unsigned_long *)0x0,uVar8,1,false,
                           (IsoForest *)&temp,(ExtIsoForest *)0x0,
                           (double *)
                           ignored._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl,
                           terminal_indices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,(double *)0x0,local_328);
                std::
                vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ::~vector((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           *)&temp);
              }
              std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
                        ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,
                         (pointer)0x0);
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                         &(local_328->indices).
                          super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].reference_points,
                         terminal_indices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         terminal_indices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit
                        (&(local_328->indices).
                          super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].reference_points);
              build_ref_node((local_328->indices).
                             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -1);
              std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&terminal_indices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            }
            check_interrupt_switch(&ss);
          }
          SignalSwitcher::~SignalSwitcher(&ss);
          std::
          unique_ptr<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>,_std::default_delete<WorkerMemory<ImputedData<unsigned_long,_long_double>,_long_double,_float>_>_>
          ::~unique_ptr(&workspace);
          InputData<float,_unsigned_long>::~InputData(&local_180);
          return 0;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "\'indexer\' has reference points. Those points must be passed to index them in the new tree to add.\n"
                  );
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"\'prob_pick_by_full_gain\' is not compatible with categorical data.\n");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"\'prob_pick_col_by_range\' is not compatible with categorical data.\n");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int add_tree_internal(
             IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
             real_t numeric_data[],  size_t ncols_numeric,
             int    categ_data[],    size_t ncols_categ,    int ncat[],
             real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
             size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
             real_t sample_weights[], size_t nrows,
             size_t max_depth,     size_t ncols_per_tree,
             bool   limit_depth,   bool penalize_range, bool standardize_data,
             bool   fast_bratio,
             real_t col_weights[], bool weigh_by_kurt,
             double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
             double prob_pick_by_full_gain, double prob_pick_by_dens,
             double prob_pick_col_by_range, double prob_pick_col_by_var,
             double prob_pick_col_by_kurt,
             double min_gain, MissingAction missing_action,
             CategSplit cat_split_type, NewCategAction new_cat_action,
             UseDepthImp depth_imp, WeighImpRows weigh_imp_rows,
             bool   all_perm, Imputer *imputer, size_t min_imp_obs,
             TreesIndexer *indexer,
             real_t ref_numeric_data[], int ref_categ_data[],
             bool ref_is_col_major, size_t ref_ld_numeric, size_t ref_ld_categ,
             real_t ref_Xc[], sparse_ix ref_Xc_ind[], sparse_ix ref_Xc_indptr[],
             uint64_t random_seed)
{
    if (
        prob_pick_by_gain_avg  < 0  || prob_pick_by_gain_pl  < 0 ||
        prob_pick_by_full_gain < 0  || prob_pick_by_dens     < 0 ||
        prob_pick_col_by_range < 0  ||
        prob_pick_col_by_var   < 0  || prob_pick_col_by_kurt < 0
    ) {
        throw std::runtime_error("Cannot pass negative probabilities.\n");
    }
    if (prob_pick_col_by_range && ncols_categ)
        throw std::runtime_error("'prob_pick_col_by_range' is not compatible with categorical data.\n");
    if (prob_pick_by_full_gain && ncols_categ)
        throw std::runtime_error("'prob_pick_by_full_gain' is not compatible with categorical data.\n");
    if (prob_pick_col_by_kurt && weigh_by_kurt)
        throw std::runtime_error("'weigh_by_kurt' and 'prob_pick_col_by_kurt' cannot be used together.\n");
    if (ndim == 0 && model_outputs == NULL)
        throw std::runtime_error("Must pass 'ndim>0' in the extended model.\n");
    if (indexer != NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty()) {
        if (ref_numeric_data == NULL && ref_categ_data == NULL && ref_Xc_indptr == NULL)
            throw std::runtime_error("'indexer' has reference points. Those points must be passed to index them in the new tree to add.\n");
    }

    std::vector<ImputeNode> *impute_nodes = NULL;

    int max_categ = 0;
    for (size_t col = 0; col < ncols_categ; col++)
        max_categ = (ncat[col] > max_categ)? ncat[col] : max_categ;

    if (model_outputs != NULL)
        ntry = std::min(ntry, ncols_numeric + ncols_categ);

    if (ncols_per_tree == 0)
        ncols_per_tree = ncols_numeric + ncols_categ;

    if (indexer != NULL && indexer->indices.empty())
        indexer = NULL;

    InputData<real_t, sparse_ix>
              input_data     = {numeric_data, ncols_numeric, categ_data, ncat, max_categ, ncols_categ,
                                nrows, ncols_numeric + ncols_categ, sample_weights,
                                false, col_weights,
                                Xc, Xc_ind, Xc_indptr,
                                0, 0, std::vector<double>(),
                                std::vector<char>(), 0, NULL,
                                (double*)NULL, (double*)NULL, (int*)NULL, std::vector<double>(),
                                std::vector<double>(), std::vector<double>(),
                                std::vector<size_t>(), std::vector<size_t>()};
    ModelParams model_params = {false, nrows, (size_t)1, ncols_per_tree,
                                max_depth? max_depth : (nrows - 1),
                                penalize_range, standardize_data, random_seed, weigh_by_kurt,
                                prob_pick_by_gain_avg, prob_pick_by_gain_pl,
                                prob_pick_by_full_gain, prob_pick_by_dens,
                                prob_pick_col_by_range, prob_pick_col_by_var,
                                prob_pick_col_by_kurt,
                                min_gain, cat_split_type, new_cat_action, missing_action,
                                (model_outputs != NULL)? model_outputs->scoring_metric : model_outputs_ext->scoring_metric,
                                fast_bratio, all_perm,
                                (model_outputs != NULL)? 0 : ndim, ntry,
                                coef_type, coef_by_prop, false, false, false, depth_imp, weigh_imp_rows, min_imp_obs};

    if (prob_pick_by_full_gain)
    {
        if (input_data.Xc_indptr == NULL)
            colmajor_to_rowmajor(input_data.numeric_data, input_data.nrows, input_data.ncols_numeric, input_data.X_row_major);
        else
            colmajor_to_rowmajor(input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                 input_data.nrows, input_data.ncols_numeric,
                                 input_data.Xr, input_data.Xr_ind, input_data.Xr_indptr);
    }

    std::unique_ptr<WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>> workspace(
        new WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t>()
    );

    size_t last_tree;
    bool added_tree = false;
    try
    {
        if (model_outputs != NULL)
        {
            last_tree = model_outputs->trees.size();
            model_outputs->trees.emplace_back();
            added_tree = true;
        }

        else
        {
            last_tree = model_outputs_ext->hplanes.size();
            model_outputs_ext->hplanes.emplace_back();
            added_tree = true;
        }

        if (imputer != NULL)
        {
            imputer->imputer_tree.emplace_back();
            impute_nodes = &(imputer->imputer_tree.back());
        }

        if (indexer != NULL)
        {
            indexer->indices.emplace_back();
        }

        SignalSwitcher ss = SignalSwitcher();
        check_interrupt_switch(ss);

        fit_itree<decltype(input_data), typename std::remove_pointer<decltype(workspace.get())>::type, ldouble_safe>(
                  (model_outputs != NULL)? &model_outputs->trees.back() : NULL,
                  (model_outputs_ext != NULL)? &model_outputs_ext->hplanes.back() : NULL,
                  *workspace,
                  input_data,
                  model_params,
                  impute_nodes,
                  last_tree);

        check_interrupt_switch(ss);

        if (model_outputs != NULL) {
            model_outputs->trees.back().shrink_to_fit();
            model_outputs->has_range_penalty = model_outputs->has_range_penalty || penalize_range;
        }
        else {
            model_outputs_ext->hplanes.back().shrink_to_fit();
            model_outputs_ext->has_range_penalty = model_outputs_ext->has_range_penalty || penalize_range;
        }

        if (imputer != NULL)
            imputer->imputer_tree.back().shrink_to_fit();

        if (indexer != NULL)
        {
            if (model_outputs != NULL)
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs->trees.back());
            else
                build_terminal_node_mappings_single_tree(indexer->indices.back().terminal_node_mappings,
                                                         indexer->indices.back().n_terminal,
                                                         model_outputs_ext->hplanes.back());

            check_interrupt_switch(ss);


            if (!indexer->indices.front().node_distances.empty())
            {
                std::vector<size_t> temp;
                temp.reserve(indexer->indices.back().n_terminal);
                if (model_outputs != NULL) {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs->trees.back()
                    );
                }
                else {
                    build_dindex(
                        temp,
                        indexer->indices.back().terminal_node_mappings,
                        indexer->indices.back().node_distances,
                        indexer->indices.back().node_depths,
                        indexer->indices.back().n_terminal,
                        model_outputs_ext->hplanes.back()
                    );
                }
            }

            check_interrupt_switch(ss);
            if (!indexer->indices.front().reference_points.empty())
            {
                size_t n_ref = indexer->indices.front().reference_points.size();
                std::vector<sparse_ix> terminal_indices(n_ref);
                std::unique_ptr<double[]> ignored(new double[n_ref]);
                if (model_outputs != NULL)
                {
                    IsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs->cat_split_type;
                    single_tree_model.missing_action = model_outputs->missing_action;
                    single_tree_model.trees.push_back(model_outputs->trees.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    &single_tree_model, (ExtIsoForest*)NULL,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                else
                {
                    ExtIsoForest single_tree_model;
                    single_tree_model.new_cat_action = model_outputs_ext->new_cat_action;
                    single_tree_model.cat_split_type = model_outputs_ext->cat_split_type;
                    single_tree_model.missing_action = model_outputs_ext->missing_action;
                    single_tree_model.hplanes.push_back(model_outputs_ext->hplanes.back());

                    predict_iforest(ref_numeric_data, ref_categ_data,
                                    ref_is_col_major, ref_ld_numeric, ref_ld_categ,
                                    ref_Xc, ref_Xc_ind, ref_Xc_indptr,
                                    (real_t*)NULL, (sparse_ix*)NULL, (sparse_ix*)NULL,
                                    n_ref, 1, false,
                                    (IsoForest*)NULL, &single_tree_model,
                                    ignored.get(), terminal_indices.data(),
                                    (double*)NULL,
                                    indexer);
                }

                ignored.reset();
                indexer->indices.back().reference_points.assign(terminal_indices.begin(), terminal_indices.end());
                indexer->indices.back().reference_points.shrink_to_fit();
                build_ref_node(indexer->indices.back());
            }

            check_interrupt_switch(ss);
        }
    }

    catch (...)
    {
        if (added_tree)
        {
            if (model_outputs != NULL)
                model_outputs->trees.pop_back();
            else
                model_outputs_ext->hplanes.pop_back();
            if (imputer != NULL) {
                if (model_outputs != NULL)
                    imputer->imputer_tree.resize(model_outputs->trees.size());
                else
                    imputer->imputer_tree.resize(model_outputs_ext->hplanes.size());
            }
            if (indexer != NULL) {
                if (model_outputs != NULL)
                    indexer->indices.resize(model_outputs->trees.size());
                else
                    indexer->indices.resize(model_outputs_ext->hplanes.size());
            }
        }
        throw;
    }

    return EXIT_SUCCESS;
}